

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void fs_print_error(string_view path,string_view fname)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"ERROR: Ffilesystem:");
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,fname._M_str,fname._M_len);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,path._M_str,path._M_len);
  std::operator<<(poVar1,")  ");
  fs_emit_error();
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  return;
}

Assistant:

void fs_print_error(std::string_view path, std::string_view fname)
{

  std::cerr << "ERROR: Ffilesystem:" << fname << "(" << path << ")  ";

  fs_emit_error();

  std::cerr << std::endl;
}